

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_time.cpp
# Opt level: O1

Am_Wrapper * __thiscall Am_Time_Data::Make_Unique(Am_Time_Data *this)

{
  uint uVar1;
  Am_Time_Data *pAVar2;
  
  uVar1 = (this->super_Am_Wrapper).refs;
  pAVar2 = this;
  if (uVar1 != 1) {
    uVar1 = uVar1 - 1;
    (this->super_Am_Wrapper).refs = uVar1;
    if (uVar1 == 0) {
      (*(this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(this);
    }
    pAVar2 = (Am_Time_Data *)operator_new(0x20);
    (pAVar2->super_Am_Wrapper).refs = 1;
    (pAVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
         (_func_int **)&PTR_ID_002e47a0;
    (pAVar2->time).tv_usec = (this->time).tv_usec;
    (pAVar2->time).tv_sec = (this->time).tv_sec;
  }
  return &pAVar2->super_Am_Wrapper;
}

Assistant:

void
Am_Time_Data::Print(std::ostream &os) const
{
  //  os << time.tv_sec <<"s:"<< time.tv_usec << "us";
  os << time.tv_sec * 1000 + time.tv_usec / 1000 << " milliseconds";
}